

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::OnTryTableCatch(TypeChecker *this,TypeVector *sig,Index depth)

{
  Result RVar1;
  char *prefix;
  TypeChecker *this_00;
  _anonymous_namespace_ *this_01;
  Label *label;
  string local_70;
  string local_50;
  
  this_00 = this;
  RVar1 = GetLabel(this,depth,&label);
  if (RVar1.enum_ != Error) {
    this_01 = (_anonymous_namespace_ *)&label->result_types;
    if (label->label_type == Loop) {
      this_01 = (_anonymous_namespace_ *)&label->param_types;
    }
    RVar1 = CheckTypes(this_00,(TypeVector *)this_01,sig);
    prefix = (char *)(ulong)RVar1.enum_;
    if (RVar1.enum_ != Error) {
      return (Result)Ok;
    }
    (anonymous_namespace)::TypesToString_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)sig,(TypeVector *)0x0,prefix);
    (anonymous_namespace)::TypesToString_abi_cxx11_(&local_70,this_01,(TypeVector *)0x0,prefix);
    PrintError(this,"catch signature doesn\'t match target: expected %s, got %s",
               local_50._M_dataplus._M_p,local_70._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  return (Result)Error;
}

Assistant:

Result TypeChecker::OnTryTableCatch(const TypeVector& sig, Index depth) {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(GetLabel(depth, &label));
  TypeVector& label_sig = label->br_types();
  result |= CheckTypes(label_sig, sig);
  if (Failed(result)) {
    PrintError("catch signature doesn't match target: expected %s, got %s",
               TypesToString(sig).c_str(), TypesToString(label_sig).c_str());
  }
  return result;
}